

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O1

void __thiscall tst_qpromise_operators::move_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar2;
  _func_int **pp_Var3;
  PromiseResolver<void> PVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar5;
  QArrayData *pQVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar12;
  QObject *pQVar13;
  int *piVar14;
  QEvent *pQVar15;
  PromiseDataBase<void,_void_()> *pPVar16;
  QSharedData *pQVar17;
  char *pcVar18;
  PromiseData<void> *tmp;
  QByteArrayView QVar19;
  QStringView QVar20;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e8;
  QPromise<void> p0;
  QPromise<void> local_d0;
  qsizetype local_c0;
  PromiseResolver<void> resolver_2;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_78;
  QArrayData *local_70;
  _Any_data local_68;
  _Manager_type local_58;
  _func_int **local_48;
  _func_int **local_40;
  _func_int **local_38;
  
  QtPromise::QPromise<void>::resolve();
  QVar12 = p0.super_QPromiseBase<void>.m_d;
  bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  bVar7 = (bool)(~bVar7 & ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                          _M_exception_object == (void *)0x0);
  local_68._M_pod_data[0] = bVar7;
  resolver.m_d.d._0_1_ = 1;
  pcVar10 = QTest::toString<bool>((bool *)local_68._M_pod_data);
  pcVar11 = QTest::toString<bool>((bool *)&resolver);
  cVar8 = QTest::compare_helper
                    (bVar7,"Compared values are not the same",pcVar10,pcVar11,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x40);
  if (cVar8 != '\0') {
    local_68._0_4_ = 0xffffffff;
    resolver.m_d.d._0_4_ = 0x2a;
    iVar9 = waitForValue<int>(&p0,(int *)local_68._M_pod_data,(int *)&resolver);
    cVar8 = QTest::qCompare(iVar9,0x2a,"waitForValue(p0, -1, 42)","42",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                            ,0x41);
    if (cVar8 != '\0') {
      QVar12.d = (PromiseData<void> *)operator_new(0x58);
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&((QVar12.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_lock = 0;
      *(undefined8 *)&((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_settled = 0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
           (void *)0x0;
      local_38 = (_func_int **)&PTR__PromiseDataBase_0011cb48;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
           (_func_int **)&PTR__PromiseDataBase_0011cb48;
      QReadWriteLock::QReadWriteLock(&((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_lock,0);
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_settled = false;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
           (void *)0x0;
      local_40 = (_func_int **)&PTR__PromiseDataBase_0011cad0;
      ((QVar12.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
           (_func_int **)&PTR__PromiseDataBase_0011cad0;
      LOCK();
      pQVar17 = &((QVar12.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
      (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      pQVar17 = &((QVar12.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
      (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_48 = (_func_int **)&PTR__QPromiseBase_0011ca68;
      local_68._M_unused._M_object = &PTR__QPromiseBase_0011ca68;
      local_68._8_8_ = QVar12.d;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                (&resolver,(QPromise<void> *)&local_68);
      local_68._M_unused._M_object = &PTR__QPromiseBase_0011cab0;
      if ((PromiseData<void> *)local_68._8_8_ != (PromiseData<void> *)0x0) {
        LOCK();
        pQVar17 = (QSharedData *)(local_68._8_8_ + 8);
        (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           ((PromiseData<void> *)local_68._8_8_ != (PromiseData<void> *)0x0)) {
          (**(code **)(*(long *)local_68._8_8_ + 8))();
        }
      }
      PVar4.m_d.d = resolver.m_d.d;
      local_70 = (QArrayData *)&PTR__QPromiseBase_0011cab0;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      pQVar13 = (QObject *)QThread::currentThread();
      if (pQVar13 == (QObject *)0x0) {
        piVar14 = (int *)0x0;
      }
      else {
        piVar14 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar13);
      }
      if (piVar14 != (int *)0x0) {
        if (((pQVar13 != (QObject *)0x0) && (piVar14[1] != 0)) &&
           (cVar8 = QThread::isFinished(), cVar8 == '\0')) {
          if (piVar14[1] == 0) {
            pQVar13 = (QObject *)(QThread *)0x0;
          }
          pQVar13 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar13);
          if ((pQVar13 != (QObject *)0x0) ||
             (cVar8 = QCoreApplication::closingDown(), cVar8 == '\0')) {
            pQVar15 = (QEvent *)operator_new(0x18);
            QEvent::QEvent(pQVar15,None);
            *(undefined ***)pQVar15 = &PTR__Event_0011c800;
            *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             (pQVar15 + 0x10) = PVar4.m_d.d;
            if (PVar4.m_d.d != (Data *)0x0) {
              LOCK();
              *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
              UNLOCK();
            }
            QCoreApplication::postEvent(pQVar13,pQVar15,0);
          }
        }
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          operator_delete(piVar14);
        }
      }
      if (PVar4.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
        UNLOCK();
        if (*(int *)PVar4.m_d.d == 0) {
          operator_delete((void *)PVar4.m_d.d,0x10);
        }
        LOCK();
        *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
        UNLOCK();
        if (*(int *)PVar4.m_d.d == 0) {
          operator_delete((void *)PVar4.m_d.d,0x10);
        }
      }
      if (PVar4.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
        UNLOCK();
        if (*(int *)PVar4.m_d.d == 0) {
          operator_delete((void *)PVar4.m_d.d,0x10);
        }
      }
      pQVar6 = local_70;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
        UNLOCK();
        if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
          operator_delete((void *)resolver.m_d.d,0x10);
        }
      }
      if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
        LOCK();
        pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                   super_QSharedData;
        (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          pPVar16 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>;
          p0.super_QPromiseBase<void>.m_d.d = QVar12.d;
          (*pPVar16->_vptr_PromiseDataBase[1])();
          QVar12.d = p0.super_QPromiseBase<void>.m_d.d;
        }
      }
      p0.super_QPromiseBase<void>.m_d.d = QVar12.d;
      bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                        (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>)
      ;
      local_68._M_pod_data[0] = bVar7;
      resolver.m_d.d._0_1_ = 1;
      pcVar10 = QTest::toString<bool>((bool *)local_68._M_pod_data);
      pcVar11 = QTest::toString<bool>((bool *)&resolver);
      pcVar18 = "p0.isPending()";
      cVar8 = QTest::compare_helper
                        (bVar7,"Compared values are not the same",pcVar10,pcVar11,"p0.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x4a);
      if (cVar8 != '\0') {
        resolver_2.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             (Data *)0x0;
        pPVar16 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
        pPVar16->_vptr_PromiseDataBase = (_func_int **)0x0;
        *(undefined8 *)&pPVar16->super_QSharedData = 0;
        (pPVar16->m_catchers).d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)0x0;
        (pPVar16->m_catchers).d.size = 0;
        (pPVar16->m_handlers).d.size = 0;
        (pPVar16->m_catchers).d.d = (Data *)0x0;
        (pPVar16->m_handlers).d.d = (Data *)0x0;
        (pPVar16->m_handlers).d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
        *(undefined8 *)&pPVar16->m_lock = 0;
        *(undefined8 *)&pPVar16->m_settled = 0;
        (pPVar16->m_error).m_data._M_exception_object = (void *)0x0;
        pPVar16->_vptr_PromiseDataBase = local_38;
        QReadWriteLock::QReadWriteLock(&pPVar16->m_lock,0);
        pPVar16->m_settled = false;
        (pPVar16->m_handlers).d.d = (Data *)0x0;
        (pPVar16->m_handlers).d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
        (pPVar16->m_handlers).d.size = 0;
        (pPVar16->m_catchers).d.d = (Data *)0x0;
        (pPVar16->m_catchers).d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
              *)0x0;
        (pPVar16->m_catchers).d.size = 0;
        (pPVar16->m_error).m_data._M_exception_object = (void *)0x0;
        pPVar16->_vptr_PromiseDataBase = local_40;
        LOCK();
        (pPVar16->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pPVar16->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pQVar17 = &pPVar16->super_QSharedData;
        LOCK();
        (pPVar16->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pPVar16->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_d0.super_QPromiseBase<void>._vptr_QPromiseBase = local_48;
        local_d0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pPVar16;
        QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_d0);
        local_d0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)pQVar6;
        if (&(local_d0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
            (PromiseDataBase<void,_void_()> *)0x0) {
          LOCK();
          pQVar1 = &((local_d0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                    ).super_QSharedData;
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i == 0) &&
             (&(local_d0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
              (PromiseDataBase<void,_void_()> *)0x0)) {
            (*((local_d0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              _vptr_PromiseDataBase[1])();
          }
        }
        QVar12.d = p0.super_QPromiseBase<void>.m_d.d;
        if (resolver_1.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
          UNLOCK();
        }
        local_e8 = resolver_1.m_d.d;
        if (resolver_1.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
          UNLOCK();
        }
        local_78 = resolver_1.m_d.d;
        QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
        create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                  ((function<void_()> *)&local_68,(PromiseHandler<void,decltype(nullptr),void> *)0x0
                   ,&local_e8,(QPromiseResolve<void> *)&local_78,(QPromiseReject<void> *)pcVar18);
        QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
                  (&(QVar12.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_68)
        ;
        if (local_58 != (_Manager_type)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        QVar5.d = local_78.d;
        QVar12.d = p0.super_QPromiseBase<void>.m_d.d;
        QVar2.d = local_e8.d;
        if (local_e8.d != (Data *)0x0) {
          LOCK();
          ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (local_78.d != (Data *)0x0) {
          LOCK();
          ((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        resolver.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             (Data *)0x0;
        resolver.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             operator_new(0x18);
        *(Data **)resolver.m_d.d = QVar2.d;
        if (QVar2.d != (Data *)0x0) {
          LOCK();
          ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)QVar5.d;
        if (QVar5.d == (Data *)0x0) {
          *(PromiseResolver<void> **)((long)resolver.m_d.d + 0x10) = &resolver_2;
        }
        else {
          LOCK();
          ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          *(PromiseResolver<void> **)((long)resolver.m_d.d + 0x10) = &resolver_2;
          LOCK();
          ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((QVar5.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            operator_delete(QVar5.d,0x10);
          }
        }
        if (QVar2.d != (Data *)0x0) {
          LOCK();
          ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
            operator_delete(QVar2.d,0x10);
          }
        }
        QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                  (&(QVar12.d)->super_PromiseDataBase<void,_void_()>,
                   (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
        pQVar6 = local_70;
        std::
        _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
        ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
        if (local_78.d != (Data *)0x0) {
          LOCK();
          ((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)
                ((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if (((__int_type)
               ((local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
             (local_78.d != (Data *)0x0)) {
            operator_delete(local_78.d,0x10);
          }
        }
        if (local_e8.d != (Data *)0x0) {
          LOCK();
          ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
             (local_e8.d != (Data *)0x0)) {
            operator_delete(local_e8.d,0x10);
          }
        }
        if (resolver_1.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
          UNLOCK();
          if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
            operator_delete((void *)resolver_1.m_d.d,0x10);
          }
        }
        bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                          (&(p0.super_QPromiseBase<void>.m_d.d)->
                            super_PromiseDataBase<void,_void_()>);
        if (!bVar7) {
          QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
        }
        bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar16);
        while (bVar7 != false) {
          QCoreApplication::processEvents();
          QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
          bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar16);
        }
        LOCK();
        (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          (*pPVar16->_vptr_PromiseDataBase[1])(pPVar16);
        }
        LOCK();
        (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          (*pPVar16->_vptr_PromiseDataBase[1])(pPVar16);
        }
        QVar19.m_data = (storage_type *)0x3;
        QVar19.m_size = (qsizetype)&local_d0;
        QString::fromUtf8(QVar19);
        pp_Var3 = local_d0.super_QPromiseBase<void>._vptr_QPromiseBase;
        QVar20.m_data = (storage_type_conflict *)local_d0.super_QPromiseBase<void>.m_d.d;
        QVar20.m_size = local_c0;
        cVar8 = QTest::qCompare((QStringView)ZEXT816(0),QVar20,"waitForError(p0, QString{})",
                                "QString{\"foo\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                                ,0x4b);
        if ((QArrayData *)pp_Var3 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)pp_Var3,2,8);
          }
        }
        if (resolver_2.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
          UNLOCK();
          if (*(int *)resolver_2.m_d.d == 0) {
            QArrayData::deallocate((QArrayData *)resolver_2.m_d.d,2,8);
          }
        }
        if (cVar8 != '\0') {
          QVar12.d = (PromiseData<void> *)operator_new(0x58);
          ((PromiseDataBase<void,_void_()> *)QVar12.d)->_vptr_PromiseDataBase = (_func_int **)0x0;
          *(undefined8 *)&((PromiseDataBase<void,_void_()> *)QVar12.d)->super_QSharedData = 0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_catchers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_catchers).d.size = 0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_handlers).d.size = 0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_catchers).d.d = (Data *)0x0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_handlers).d.d = (Data *)0x0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_handlers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          *(undefined8 *)&((PromiseDataBase<void,_void_()> *)QVar12.d)->m_lock = 0;
          *(undefined8 *)&((PromiseDataBase<void,_void_()> *)QVar12.d)->m_settled = 0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_error).m_data._M_exception_object =
               (void *)0x0;
          ((PromiseDataBase<void,_void_()> *)QVar12.d)->_vptr_PromiseDataBase = local_38;
          QReadWriteLock::QReadWriteLock(&((PromiseDataBase<void,_void_()> *)QVar12.d)->m_lock,0);
          ((PromiseDataBase<void,_void_()> *)QVar12.d)->m_settled = false;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_handlers).d.d = (Data *)0x0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_handlers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_handlers).d.size = 0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_catchers).d.d = (Data *)0x0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_catchers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_catchers).d.size = 0;
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->m_error).m_data._M_exception_object =
               (void *)0x0;
          ((PromiseDataBase<void,_void_()> *)QVar12.d)->_vptr_PromiseDataBase = local_40;
          LOCK();
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->super_QSharedData).ref.
          super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>
          ._M_i = (((PromiseDataBase<void,_void_()> *)QVar12.d)->super_QSharedData).ref.
                  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (((PromiseDataBase<void,_void_()> *)QVar12.d)->super_QSharedData).ref.
          super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>
          ._M_i = (((PromiseDataBase<void,_void_()> *)QVar12.d)->super_QSharedData).ref.
                  super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                  super___atomic_base<int>._M_i + 1;
          UNLOCK();
          local_d0.super_QPromiseBase<void>._vptr_QPromiseBase = local_48;
          local_d0.super_QPromiseBase<void>.m_d.d = QVar12.d;
          QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,&local_d0);
          local_d0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)pQVar6;
          if (&(local_d0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
              (PromiseDataBase<void,_void_()> *)0x0) {
            LOCK();
            pQVar17 = &((local_d0.super_QPromiseBase<void>.m_d.d)->
                       super_PromiseDataBase<void,_void_()>).super_QSharedData;
            (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i == 0) &&
               (&(local_d0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
                (PromiseDataBase<void,_void_()> *)0x0)) {
              (*((local_d0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                _vptr_PromiseDataBase[1])();
            }
          }
          PVar4.m_d.d = resolver_2.m_d.d;
          if (resolver_2.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
            UNLOCK();
            LOCK();
            *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
            UNLOCK();
          }
          pQVar13 = (QObject *)QThread::currentThread();
          if (pQVar13 == (QObject *)0x0) {
            piVar14 = (int *)0x0;
          }
          else {
            piVar14 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar13);
          }
          if (piVar14 != (int *)0x0) {
            if (((pQVar13 != (QObject *)0x0) && (piVar14[1] != 0)) &&
               (cVar8 = QThread::isFinished(), cVar8 == '\0')) {
              if (piVar14[1] == 0) {
                pQVar13 = (QObject *)(QThread *)0x0;
              }
              pQVar13 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar13);
              if ((pQVar13 != (QObject *)0x0) ||
                 (cVar8 = QCoreApplication::closingDown(), cVar8 == '\0')) {
                pQVar15 = (QEvent *)operator_new(0x18);
                QEvent::QEvent(pQVar15,None);
                *(undefined ***)pQVar15 = &PTR__Event_0011c858;
                *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
                 (pQVar15 + 0x10) = PVar4.m_d.d;
                if (PVar4.m_d.d != (Data *)0x0) {
                  LOCK();
                  *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
                  UNLOCK();
                }
                QCoreApplication::postEvent(pQVar13,pQVar15,0);
              }
            }
            LOCK();
            *piVar14 = *piVar14 + -1;
            UNLOCK();
            if (*piVar14 == 0) {
              operator_delete(piVar14);
            }
          }
          if (PVar4.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
            UNLOCK();
            if (*(int *)PVar4.m_d.d == 0) {
              operator_delete((void *)PVar4.m_d.d,0x10);
            }
            LOCK();
            *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
            UNLOCK();
            if (*(int *)PVar4.m_d.d == 0) {
              operator_delete((void *)PVar4.m_d.d,0x10);
            }
          }
          if (resolver_2.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
            UNLOCK();
            if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
              operator_delete((void *)resolver_2.m_d.d,0x10);
            }
          }
          if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
            LOCK();
            pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                       super_QSharedData;
            (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int>._M_i == 0) {
              pPVar16 = &(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>;
              p0.super_QPromiseBase<void>.m_d.d = QVar12.d;
              (*pPVar16->_vptr_PromiseDataBase[1])();
              QVar12.d = p0.super_QPromiseBase<void>.m_d.d;
            }
          }
          p0.super_QPromiseBase<void>.m_d.d = QVar12.d;
          bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                            (&(p0.super_QPromiseBase<void>.m_d.d)->
                              super_PromiseDataBase<void,_void_()>);
          local_d0.super_QPromiseBase<void>._vptr_QPromiseBase =
               (_func_int **)
               CONCAT71(local_d0.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar7);
          resolver_2.m_d.d._0_1_ = 1;
          pcVar10 = QTest::toString<bool>((bool *)&local_d0);
          pcVar11 = QTest::toString<bool>((bool *)&resolver_2);
          cVar8 = QTest::compare_helper
                            (bVar7,"Compared values are not the same",pcVar10,pcVar11,
                             "p0.isPending()","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x53);
          if (cVar8 != '\0') {
            local_d0.super_QPromiseBase<void>._vptr_QPromiseBase =
                 (_func_int **)
                 CONCAT44(local_d0.super_QPromiseBase<void>._vptr_QPromiseBase._4_4_,0xffffffff);
            resolver_2.m_d.d._0_4_ = 0x2b;
            iVar9 = waitForValue<int>(&p0,(int *)&local_d0,(int *)&resolver_2);
            QTest::qCompare(iVar9,0x2b,"waitForValue(p0, -1, 43)","43",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                            ,0x54);
          }
        }
      }
    }
  }
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011cab0;
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_operators::move_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1, 42), 42);

    p0 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<void>{[](const QtPromise::QPromiseResolve<void>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve();
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1, 43), 43);
}